

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_verify(secp256k1_fe *a)

{
  ulong *in_RDI;
  int m;
  uint64_t *d;
  int local_18;
  
  if (*(int *)((long)in_RDI + 0x2c) == 0) {
    local_18 = (int)in_RDI[5] << 1;
  }
  else {
    local_18 = 1;
  }
  if ((ulong)((long)local_18 * 0xfffffffffffff) < *in_RDI) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x16,"test condition failed: d[0] <= 0xFFFFFFFFFFFFFULL * m");
    abort();
  }
  if ((ulong)((long)local_18 * 0xfffffffffffff) < in_RDI[1]) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x17,"test condition failed: d[1] <= 0xFFFFFFFFFFFFFULL * m");
    abort();
  }
  if (in_RDI[2] <= (ulong)((long)local_18 * 0xfffffffffffff)) {
    if ((ulong)((long)local_18 * 0xfffffffffffff) < in_RDI[3]) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
              ,0x19,"test condition failed: d[3] <= 0xFFFFFFFFFFFFFULL * m");
      abort();
    }
    if (in_RDI[4] <= (ulong)((long)local_18 * 0xffffffffffff)) {
      if ((((*(int *)((long)in_RDI + 0x2c) != 0) && (in_RDI[4] == 0xffffffffffff)) &&
          ((in_RDI[3] & in_RDI[2] & in_RDI[1]) == 0xfffffffffffff)) && (0xffffefffffc2e < *in_RDI))
      {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
                ,0x1d,"test condition failed: d[0] < 0xFFFFEFFFFFC2FULL");
        abort();
      }
      return;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x1a,"test condition failed: d[4] <= 0x0FFFFFFFFFFFFULL * m");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
          ,0x18,"test condition failed: d[2] <= 0xFFFFFFFFFFFFFULL * m");
  abort();
}

Assistant:

static void secp256k1_fe_impl_verify(const secp256k1_fe *a) {
    const uint64_t *d = a->n;
    int m = a->normalized ? 1 : 2 * a->magnitude;
   /* secp256k1 'p' value defined in "Standards for Efficient Cryptography" (SEC2) 2.7.1. */
    VERIFY_CHECK(d[0] <= 0xFFFFFFFFFFFFFULL * m);
    VERIFY_CHECK(d[1] <= 0xFFFFFFFFFFFFFULL * m);
    VERIFY_CHECK(d[2] <= 0xFFFFFFFFFFFFFULL * m);
    VERIFY_CHECK(d[3] <= 0xFFFFFFFFFFFFFULL * m);
    VERIFY_CHECK(d[4] <= 0x0FFFFFFFFFFFFULL * m);
    if (a->normalized) {
        if ((d[4] == 0x0FFFFFFFFFFFFULL) && ((d[3] & d[2] & d[1]) == 0xFFFFFFFFFFFFFULL)) {
            VERIFY_CHECK(d[0] < 0xFFFFEFFFFFC2FULL);
        }
    }
}